

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
diffusion::ShmReader::cyclic_read
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,ShmReader *this,Size size)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_type __n;
  allocator_type local_31;
  
  __n = (size_type)size;
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,__n,&local_31);
  if (0 < size) {
    do {
      uVar2 = this->shm_body_size_ - this->reader_shm_body_offset_;
      if (size < (int)uVar2) {
        uVar2 = size;
      }
      memcpy((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start + (__n - (uint)size),
             this->shm_body_position_ + this->reader_shm_body_offset_,(long)(int)uVar2);
      iVar3 = this->reader_shm_body_offset_ + uVar2;
      if (iVar3 == this->shm_body_size_) {
        iVar3 = 0;
      }
      this->reader_shm_body_offset_ = iVar3;
      uVar4 = size - uVar2;
      bVar1 = (int)uVar2 <= size;
      size = uVar4;
    } while (uVar4 != 0 && bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> ShmReader::cyclic_read(Size size) {
    std::vector<char> data(size);
    auto bytes_left = size;
    while (bytes_left > 0) {
        auto write_pointer = data.data() + size - bytes_left;
        auto space_left = shm_body_size_ - reader_shm_body_offset_;
        auto bytes_can_be_read_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(write_pointer, shm_body_position_ + reader_shm_body_offset_, bytes_can_be_read_without_wrap);
        reader_shm_body_offset_ += bytes_can_be_read_without_wrap;
        bytes_left -= bytes_can_be_read_without_wrap;
        if (reader_shm_body_offset_ == shm_body_size_) {
            reader_shm_body_offset_ = 0;
        }
    }
    return data;
}